

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O0

void dill_begin_prefix_code(dill_stream s)

{
  long lVar1;
  undefined1 auVar2 [16];
  long *in_RDI;
  virtual_mach_info vmi;
  int in_stack_00000018;
  int in_stack_0000001c;
  dill_stream in_stack_00000020;
  
  lVar1 = *(long *)(in_RDI[1] + 0xf0);
  if (*(code **)(*in_RDI + 8) == virtual_proc_start) {
    virtual_reti(in_stack_00000020,in_stack_0000001c,in_stack_00000018,(long)s);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)((int)*(undefined8 *)(in_RDI[1] + 8) - (int)*(undefined8 *)in_RDI[1]);
    *(int *)(lVar1 + 0x18) = SUB164(auVar2 / ZEXT816(0x28),0);
    return;
  }
  __assert_fail("s->j->proc_start == (dill_mach_proc_start)virtual_proc_start",
                "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/dill/dill/virtual.c"
                ,0x1128,"void dill_begin_prefix_code(dill_stream)");
}

Assistant:

extern void
dill_begin_prefix_code(dill_stream s)
{
    virtual_mach_info vmi = (virtual_mach_info)s->p->mach_info;
    /* have to be in virtual mode */
    assert(s->j->proc_start == (dill_mach_proc_start)virtual_proc_start);
    /* insert a return, so we don't fall into prefix code */
    virtual_reti(s, DILL_I, 0, 0);
    vmi->prefix_code_start =
        (int)(s->p->cur_ip - s->p->code_base) / sizeof(virtual_insn);
}